

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_proto.c
# Opt level: O0

byte_req_pair stss_consume_response(application_protocol *proto,iovec *response)

{
  byte_req_pair bVar1;
  ulong *puVar2;
  int local_3c;
  int processed;
  char *tmp;
  long *payload_size;
  iovec *response_local;
  application_protocol *proto_local;
  byte_req_pair res;
  
  memset(&proto_local,0,0x10);
  if (response->iov_len < 8) {
    __assert_fail("response->iov_len >= sizeof(long)",
                  "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/app_proto.c"
                  ,0xcf,
                  "struct byte_req_pair stss_consume_response(struct application_protocol *, struct iovec *)"
                 );
  }
  do {
    puVar2 = (ulong *)((long)response->iov_base + (long)local_3c);
    if (*puVar2 < response->iov_len - (long)(local_3c + 8)) break;
    local_3c = local_3c + 8 + (int)*puVar2;
    res.bytes = res.bytes + 1;
    proto_local = (application_protocol *)((long)&proto_local->arg + *puVar2);
  } while (response->iov_len - (long)local_3c < 9);
  bVar1.reqs = res.bytes;
  bVar1.bytes = (uint64_t)proto_local;
  return bVar1;
}

Assistant:

struct byte_req_pair stss_consume_response(struct application_protocol *proto,
		struct iovec *response)
{
	struct byte_req_pair res = {0};
	long *payload_size;
	char *tmp;
	int processed;

	assert(response->iov_len >= sizeof(long));
	tmp = response->iov_base;
	while (1) {
		payload_size = (long *)&tmp[processed];
		processed += sizeof(long);
		if (*payload_size < (response->iov_len - processed))
			break;
		processed += *payload_size;
		res.reqs += 1;
		res.bytes += (sizeof(long) + *payload_size);
		if (sizeof(long) < (response->iov_len - processed))
			break;
	}
	return res;
}